

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.hpp
# Opt level: O0

void __thiscall Centaurus::Grammar<char>::Grammar(Grammar<char> *this)

{
  Grammar<char> *this_local;
  
  IGrammar::IGrammar(&this->super_IGrammar);
  (this->super_IGrammar)._vptr_IGrammar = (_func_int **)&PTR__Grammar_0028ec88;
  std::
  unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>_>_>
  ::unordered_map(&this->m_networks);
  std::vector<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>::vector
            (&this->m_identifiers);
  Identifier::Identifier(&this->m_root_id);
  Identifier::Identifier(&this->m_grammar_name);
  GrammarOptions::GrammarOptions(&this->m_options);
  return;
}

Assistant:

Grammar()
    {
    }